

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflect_scope.c
# Opt level: O3

int scope_destroy_cb_iterate(set s,set_key key,set_value val,set_cb_iterate_args args)

{
  if (val != (set_value)0x0) {
    value_type_destroy(val);
    return 0;
  }
  return 1;
}

Assistant:

int scope_destroy_cb_iterate(set s, set_key key, set_value val, set_cb_iterate_args args)
{
	(void)s;
	(void)key;
	(void)args;

	if (val != NULL)
	{
		value_type_destroy(val);

		return 0;
	}

	return 1;
}